

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QPolygonF * __thiscall
QGraphicsItem::mapFromParent(QPolygonF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointF> local_e0;
  QTransform local_c8;
  double local_78;
  double dStack_70;
  qreal local_68;
  qreal qStack_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->transformData == (TransformData *)0x0) {
    local_78 = rect->xp - (this_00->pos).xp;
    dStack_70 = rect->yp - (this_00->pos).yp;
    local_68 = rect->w;
    qStack_60 = rect->h;
    QPolygonF::QPolygonF(__return_storage_ptr__,(QRectF *)&local_78);
  }
  else {
    QGraphicsItemPrivate::transformToParent(&local_c8,this_00);
    QTransform::inverted((bool *)&local_78);
    QPolygonF::QPolygonF((QPolygonF *)&local_e0,(QRectF *)rect);
    QTransform::map(__return_storage_ptr__);
    QArrayDataPointer<QPointF>::~QArrayDataPointer(&local_e0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapFromParent(const QRectF &rect) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return rect.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().map(rect);
}